

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

int readbtable(fitsfile *fptr,int *status)

{
  int iVar1;
  long local_78;
  long local_70;
  double local_68;
  double elapse;
  float cpufrac;
  float elapcpu;
  float size;
  float rate;
  long lnull;
  long nrows;
  long firstelem;
  long firstrow;
  long ntodo;
  long nremain;
  int anynull;
  int hdutype;
  int *status_local;
  fitsfile *fptr_local;
  
  firstelem = 1;
  nrows = 1;
  _size = 0;
  _anynull = status;
  status_local = &fptr->HDUposition;
  iVar1 = ffmrhd(fptr,1,(long)&nremain + 4,status);
  if (iVar1 != 0) {
    printerror(*_anynull);
  }
  ffgrsz(status_local,&lnull,_anynull);
  if (lnull < 20000) {
    local_70 = lnull;
  }
  else {
    local_70 = 20000;
  }
  lnull = local_70;
  ntodo = 2500000;
  printf("Read back BINTABLE                              ");
  marktime(_anynull);
  for (; ntodo != 0; ntodo = ntodo - firstrow) {
    if (lnull < ntodo) {
      local_78 = lnull;
    }
    else {
      local_78 = ntodo;
    }
    firstrow = local_78;
    ffgcvj(status_local,1,firstelem,nrows,local_78,_size,sarray,&nremain,_anynull);
    ffgcvj(status_local,2,firstelem,nrows,firstrow,_size,sarray,&nremain,_anynull);
    firstelem = firstrow + firstelem;
  }
  gettime(&local_68,(float *)((long)&elapse + 4),_anynull);
  elapse._0_4_ = (float)(((double)elapse._4_4_ / local_68) * 100.0);
  cpufrac = 20.0;
  elapcpu = (float)(20.0 / local_68);
  printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4034000000000000,local_68,(double)elapse._0_4_,
         (double)elapcpu);
  return *_anynull;
}

Assistant:

int readbtable( fitsfile *fptr, int *status )

    /************************************************************/
    /* read and print data values from the binary table */
    /************************************************************/
{
    int hdutype, anynull;
    long nremain, ntodo, firstrow = 1, firstelem = 1;
    long nrows;
    long lnull = 0;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    /* move to the table */
    if ( fits_movrel_hdu(fptr, 1, &hdutype, status) ) 
           printerror( *status );

    /* get table row size and optimum number of rows to read per loop */
    fits_get_rowsize(fptr, &nrows, status);
    nrows = minvalue(nrows, SHTSIZE);
    
    /*  read the columns */  
    nremain = BROWS;

    printf("Read back BINTABLE                              ");
    marktime(status);

    while(nremain)
    {
      ntodo = minvalue(nrows, nremain);
      ffgcvj(fptr, 1, firstrow, firstelem, ntodo,
                     lnull, sarray, &anynull, status);
      ffgcvj(fptr, 2, firstrow, firstelem, ntodo,
                     lnull, sarray, &anynull, status);
      firstrow += ntodo; 
      nremain  -= ntodo;
    }

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = BROWS * 8. / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}